

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,AllocaInst *alloca,bool decl)

{
  Type *type;
  PointerType *this_00;
  undefined7 in_register_00000011;
  uint64_t local_28;
  Type *local_20;
  
  if ((int)CONCAT71(in_register_00000011,decl) == 0) {
    local_28 = Value::get_tween_id((Value *)alloca);
    append<char_const(&)[2],unsigned_long>(this,(char (*) [2])0x1a7902,&local_28);
  }
  else {
    local_28 = Value::get_tween_id((Value *)alloca);
    type = Value::getType((Value *)alloca);
    this_00 = cast<LLVMBC::PointerType>(type);
    local_20 = PointerType::getElementType(this_00);
    append<char_const(&)[2],unsigned_long,char_const(&)[11],LLVMBC::Type*>
              (this,(char (*) [2])0x1a7902,&local_28,(char (*) [11])" = alloca ",&local_20);
  }
  return;
}

Assistant:

void StreamState::append(AllocaInst *alloca, bool decl)
{
	if (decl)
	{
		append("%", alloca->get_tween_id(), " = alloca ", cast<PointerType>(alloca->getType())->getElementType());
	}
	else
	{
		append("%", alloca->get_tween_id());
	}
}